

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

PathTypeHandlerBase * __thiscall
Js::PathTypeHandlerBase::DeoptimizeObjectHeaderInlining
          (PathTypeHandlerBase *this,JavascriptLibrary *library)

{
  char *addr;
  ushort uVar1;
  Type TVar2;
  undefined8 uVar3;
  ScriptContext *pSVar4;
  code *pcVar5;
  Type TVar6;
  bool bVar7;
  PropertyTypes values;
  PropertyIndex PVar8;
  int iVar9;
  BOOL BVar10;
  undefined4 *puVar11;
  TypePath *this_00;
  undefined4 extraout_var;
  Recycler *pRVar12;
  ObjectSlotAttributes *attributes;
  undefined4 extraout_var_00;
  PathTypeHandlerWithAttr *this_01;
  long lVar13;
  uint size;
  ulong uVar14;
  undefined1 local_88 [8];
  TrackAllocData data;
  PathTypeSetterSlotIndex *local_40;
  void *__src;
  
  bVar7 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(&this->super_DynamicTypeHandler);
  if (!bVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xa46,"(IsObjectHeaderInlinedTypeHandler())",
                                "IsObjectHeaderInlinedTypeHandler()");
    if (!bVar7) goto LAB_00dc1f56;
    *puVar11 = 0;
  }
  data._32_8_ = library->recycler;
  uVar1 = (this->super_DynamicTypeHandler).unusedBytes;
  size = (uint)(uVar1 >> 1);
  this_00 = TypePath::New((Recycler *)data._32_8_,size);
  iVar9 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])(this);
  __src = (void *)CONCAT44(extraout_var,iVar9);
  if (1 < uVar1) {
    lVar13 = 0x10;
    uVar14 = 0;
    do {
      addr = (char *)((long)&(this_00->data).ptr + lVar13);
      uVar3 = *(undefined8 *)((long)&(((this->typePath).ptr)->data).ptr + lVar13);
      Memory::Recycler::WBSetBit(addr);
      *(undefined8 *)((long)&(this_00->data).ptr + lVar13) = uVar3;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      if ((__src == (void *)0x0) || (*(char *)((long)__src + uVar14) != -9)) {
        TypePath::AddInternal<true>(this_00,*(PropertyRecord **)addr);
      }
      else {
        TypePath::AddInternal<false>(this_00,*(PropertyRecord **)addr);
      }
      uVar14 = uVar14 + 1;
      lVar13 = lVar13 + 8;
    } while (size != uVar14);
  }
  uVar3 = data._32_8_;
  if (__src == (void *)0x0) {
    pSVar4 = (library->super_JavascriptLibraryBase).scriptContext.ptr;
    uVar1 = (this->super_DynamicTypeHandler).unusedBytes;
    TVar6 = (this->super_DynamicTypeHandler).slotCapacity;
    TVar2 = (this->super_DynamicTypeHandler).inlineSlotCapacity;
    PVar8 = DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
    this_01 = (PathTypeHandlerWithAttr *)
              PathTypeHandlerNoAttr::New
                        (pSVar4,this_00,uVar1 >> 1,(PropertyIndex)TVar6,TVar2 - PVar8,0x20,false,
                         false,(DynamicType *)0x0);
  }
  else {
    uVar14 = (ulong)((this_00->data).ptr)->pathSize;
    local_88 = (undefined1  [8])&ObjectSlotAttributes::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_9d226db;
    data.filename._0_4_ = 0xa6e;
    data.plusSize = uVar14;
    pRVar12 = Memory::Recycler::TrackAllocInfo((Recycler *)data._32_8_,(TrackAllocData *)local_88);
    if (uVar14 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(pRVar12,(TrackAllocData *)0x0);
      attributes = &DAT_00000008;
    }
    else {
      BVar10 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar10 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar7) goto LAB_00dc1f56;
        *puVar11 = 0;
      }
      attributes = (ObjectSlotAttributes *)
                   Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                             (pRVar12,uVar14);
      if (attributes == (ObjectSlotAttributes *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar7) goto LAB_00dc1f56;
        *puVar11 = 0;
        attributes = (ObjectSlotAttributes *)0x0;
      }
    }
    memcpy(attributes,__src,uVar14);
    iVar9 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6f])(this);
    if ((void *)CONCAT44(extraout_var_00,iVar9) == (void *)0x0) {
      local_40 = (PathTypeSetterSlotIndex *)0x0;
    }
    else {
      local_88 = (undefined1  [8])&unsigned_char::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_9d226db;
      data.filename._0_4_ = 0xa79;
      data.plusSize = uVar14;
      pRVar12 = Memory::Recycler::TrackAllocInfo((Recycler *)uVar3,(TrackAllocData *)local_88);
      if (uVar14 == 0) {
        Memory::Recycler::ClearTrackAllocInfo(pRVar12,(TrackAllocData *)0x0);
        local_40 = &DAT_00000008;
      }
      else {
        BVar10 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar10 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar11 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                      "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar7) goto LAB_00dc1f56;
          *puVar11 = 0;
        }
        local_40 = (PathTypeSetterSlotIndex *)
                   Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                             (pRVar12,uVar14);
        if (local_40 == (PathTypeSetterSlotIndex *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar11 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar7) {
LAB_00dc1f56:
            pcVar5 = (code *)invalidInstructionException();
            (*pcVar5)();
          }
          *puVar11 = 0;
          local_40 = (PathTypeSetterSlotIndex *)0x0;
        }
      }
      memcpy(local_40,(void *)CONCAT44(extraout_var_00,iVar9),uVar14);
    }
    pSVar4 = (library->super_JavascriptLibraryBase).scriptContext.ptr;
    iVar9 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x71])(this);
    uVar1 = (this->super_DynamicTypeHandler).unusedBytes;
    TVar6 = (this->super_DynamicTypeHandler).slotCapacity;
    TVar2 = (this->super_DynamicTypeHandler).inlineSlotCapacity;
    PVar8 = DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
    this_01 = PathTypeHandlerWithAttr::New
                        (pSVar4,this_00,attributes,local_40,(PathTypeSetterSlotIndex)iVar9,
                         uVar1 >> 1,(PropertyIndex)TVar6,TVar2 - PVar8,0x20,false,false,
                         (DynamicType *)0x0);
  }
  DynamicTypeHandler::SetFlags((DynamicTypeHandler *)this_01,'\b');
  values = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
  DynamicTypeHandler::CopyPropertyTypes((DynamicTypeHandler *)this_01,0xb0,values);
  return (PathTypeHandlerBase *)this_01;
}

Assistant:

PathTypeHandlerBase *PathTypeHandlerBase::DeoptimizeObjectHeaderInlining(JavascriptLibrary *const library)
    {
        Assert(IsObjectHeaderInlinedTypeHandler());

        // Clone the type Path here to evolve separately
        Recycler * recycler = library->GetRecycler();
        uint16 pathLength = GetPathLength();
        TypePath * clonedPath = TypePath::New(recycler, pathLength);

        ObjectSlotAttributes *attributes = this->GetAttributeArray();
        for (PropertyIndex i = 0; i < pathLength; i++)
        {
            clonedPath->assignments[i] = GetTypePath()->assignments[i];
            if (attributes && attributes[i] == ObjectSlotAttr_Setter)
            {
                clonedPath->AddInternal<false>(clonedPath->assignments[i]);
            }
            else
            {
                clonedPath->AddInternal<true>(clonedPath->assignments[i]);
            }
        }

        // We don't copy the fixed fields, as we will be sharing this type anyways later and the fixed fields vector has to be invalidated.
        PathTypeHandlerBase * clonedTypeHandler;
        if (attributes == nullptr)
        {
            clonedTypeHandler =
                PathTypeHandlerNoAttr::New(
                    library->GetScriptContext(),
                    clonedPath,
                    GetPathLength(),
                    static_cast<PropertyIndex>(GetSlotCapacity()),
                    GetInlineSlotCapacity() - GetObjectHeaderInlinableSlotCapacity(),
                    sizeof(DynamicObject),
                    false,
                    false);
        }
        else
        {
            uint8 newTypePathSize = clonedPath->GetPathSize();

            ObjectSlotAttributes * newAttributes = RecyclerNewArrayLeaf(recycler, ObjectSlotAttributes, newTypePathSize);
            memcpy(newAttributes, attributes, sizeof(ObjectSlotAttributes) * newTypePathSize);

            PathTypeSetterSlotIndex * setters = GetSetterSlots();
            PathTypeSetterSlotIndex * newSetters;
            if (setters == nullptr)
            {
                newSetters = nullptr;
            }
            else
            {
                newSetters = RecyclerNewArrayLeaf(recycler, PathTypeSetterSlotIndex, newTypePathSize);
                memcpy(newSetters, setters, sizeof(PathTypeSetterSlotIndex) * newTypePathSize);
            }

            clonedTypeHandler =
                PathTypeHandlerWithAttr::New(
                    library->GetScriptContext(),
                    clonedPath,
                    newAttributes,
                    newSetters,
                    GetSetterCount(),
                    GetPathLength(),
                    static_cast<PropertyIndex>(GetSlotCapacity()),
                    GetInlineSlotCapacity() - GetObjectHeaderInlinableSlotCapacity(),
                    sizeof(DynamicObject),
                    false,
                    false);
        }
        clonedTypeHandler->SetMayBecomeShared();
        clonedTypeHandler->CopyPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());

        return clonedTypeHandler;
    }